

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O0

void __thiscall inequation_Linear_Test::TestBody(inequation_Linear_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_e0;
  Message local_d8;
  ExprPtr local_d0;
  shared_ptr<const_mathiu::impl::Expr> local_c0;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ExprPtr local_60;
  ExprPtr local_50;
  ExprPtr local_40;
  ExprPtr local_30;
  undefined1 local_20 [8];
  ExprPtr e;
  inequation_Linear_Test *this_local;
  
  e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  mathiu::impl::operator____s((impl *)&local_40,"x",1);
  mathiu::impl::operator____i((impl *)&local_60,1);
  mathiu::impl::operator-((impl *)&local_50,&local_60);
  mathiu::impl::operator*((impl *)&local_30,&local_40,&local_50);
  mathiu::impl::operator____i((impl *)&gtest_ar.message_,2);
  mathiu::impl::operator<=((impl *)local_20,&local_30,(ExprPtr *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_40);
  mathiu::impl::operator____s((impl *)&local_d0,"x",1);
  EVar2 = mathiu::impl::solveInequation
                    ((impl *)&local_c0,(ExprPtr *)local_20,&local_d0,(ExprPtr *)mathiu::impl::true_)
  ;
  mathiu::impl::toString_abi_cxx11_
            (&local_b0,(impl *)&local_c0,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[20],_nullptr>
            ((EqHelper *)local_90,"toString(solveInequation(e, \"x\"_s))","\"(COInterval -2 inf)\"",
             &local_b0,(char (*) [20])"(COInterval -2 inf)");
  std::__cxx11::string::~string((string *)&local_b0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_c0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(inequation, Linear)
{
    auto const e = "x"_s * -1_i <= 2_i;
    EXPECT_EQ(toString(solveInequation(e, "x"_s)), "(COInterval -2 inf)");
}